

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int gpioWaveChain(char *buf,uint bufSize)

{
  undefined4 *puVar1;
  dmaOPage_t *pdVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  dmaOPage_t **ppdVar6;
  uint32_t *dmaAddr;
  dmaOPage_t **ppdVar7;
  FILE *pFVar8;
  int iVar9;
  uint uVar10;
  uint32_t uVar11;
  ulong uVar12;
  ulong uVar13;
  char *__format;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  int local_98;
  int local_94;
  
  pFVar8 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    myBuf2Str(bufSize,buf);
    fprintf(pFVar8,"%s %s: bufSize=%d [%s]\n",myTimeStamp::buf,"gpioWaveChain",(ulong)bufSize,
            myBuf2Str::str);
  }
  pFVar8 = _stderr;
  if (libInitialised == '\0') {
    iVar15 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      myTimeStamp();
      fprintf(pFVar8,"%s %s: pigpio uninitialised, call gpioInitialise()\n",myTimeStamp::buf,
              "gpioWaveChain");
    }
  }
  else {
    if (waveClockInited == '\0') {
      stopHardwarePWM();
      initClock(0);
      waveClockInited = '\x01';
      PWMClockInited = 0;
    }
    dmaAddr = dmaOut;
    *dmaOut = 0x80000000;
    dmaAddr[1] = 0;
    ppdVar6 = dmaOVirt;
    waveEndPtr = (uint32_t *)0x0;
    pdVar2 = *dmaOVirt;
    iVar15 = 0x203004;
    if (gpioCfg.clockPeriph == 1) {
      iVar15 = 0x20c018;
    }
    uVar11 = 0x4020048;
    if (gpioCfg.clockPeriph == 1) {
      uVar11 = 0x4050048;
    }
    uVar10 = iVar15 + pi_peri_phys;
    pdVar2->cb[0x1a].info = uVar11;
    pdVar2->cb[0x1a].dst = uVar10 & 0xffffff | 0x7e000000;
    ppdVar7 = dmaOBus;
    iVar4 = (int)*dmaOBus;
    uVar11 = iVar4 + 0xffc;
    pdVar2->cb[0x1a].src = uVar11;
    pdVar2->cb[0x1a].length = 0x50;
    pdVar2->cb[0x1a].next = iVar4 + 0x360;
    iVar14 = waveOutCount;
    uVar10 = 1;
    uVar13 = 1;
    local_94 = 0xac4;
    local_98 = 0x1b;
    uVar17 = 2;
    iVar15 = 0x1c;
    uVar21 = 2;
    uVar19 = 0;
    while( true ) {
      pFVar8 = _stderr;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar13;
      iVar9 = (uVar17 / 0x3c) * 0x3a;
      iVar18 = (int)uVar19;
      if (bufSize == uVar19) break;
      uVar20 = (uint)buf[uVar19];
      if ((iVar14 <= (int)uVar20) || (waveInfo[(int)uVar20].deleted != 0)) {
        iVar15 = -0x42;
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return -0x42;
        }
        myTimeStamp();
        __format = "%s %s: undefined wave (%d)\n";
        uVar13 = (ulong)uVar20;
        goto LAB_001146ff;
      }
      if (iVar18 == 0x256) {
        iVar15 = -0x77;
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return -0x77;
        }
        myTimeStamp();
        __format = "%s %s: chain is too long (%d)\n";
        uVar13 = 600;
        goto LAB_001146ff;
      }
      iVar5 = SUB164(auVar3 / ZEXT816(0x3c),0);
      uVar16 = iVar5 * 0x3a + 0x1b + iVar18;
      pdVar2 = ppdVar6[(ulong)uVar16 / 0x76];
      uVar12 = (ulong)(uint)((int)((uVar19 + 1 & 0xffffffff) / 0x3c) << 3);
      *(uint *)(SUB168(auVar3 / ZEXT816(0x3c),0) * -0xf0 + 0xac4 + *(long *)((long)ppdVar6 + uVar12)
               + uVar19 * 4) =
           (iVar9 + ((uint)(iVar15 + iVar9) / 0x76) * -0x76 + 0x1c + iVar18) * 0x20 +
           *(int *)(ppdVar7 + (ulong)(uint)((int)(uVar21 / 0x3c) * 0x3a + 0x1c + iVar18) / 0x76);
      uVar16 = (((uVar10 / 0x3c) * 0x3a + local_98) / 0x76) * -0x76 + uVar16;
      pdVar2->cb[uVar16].info = 0x4000008;
      pdVar2->cb[uVar16].src = local_94 + iVar5 * -0xf0 + *(int *)((long)ppdVar7 + uVar12);
      pdVar2->cb[uVar16].dst =
           *(int *)(ppdVar7 + waveInfo[(int)uVar20].topCB / 0x76) +
           ((uint)waveInfo[(int)uVar20].topCB % 0x76) * 0x20 + 0x14;
      pdVar2->cb[uVar16].length = 4;
      uVar20 = waveInfo[(int)uVar20].botCB + 1;
      pdVar2->cb[uVar16].next = (uVar20 % 0x76) * 0x20 + *(int *)(ppdVar7 + (ulong)uVar20 / 0x76);
      uVar10 = uVar10 + 1;
      local_98 = local_98 + 1;
      uVar13 = uVar13 + 1;
      local_94 = local_94 + 4;
      uVar17 = uVar17 + 1;
      iVar15 = iVar15 + 1;
      uVar21 = uVar21 + 1;
      uVar19 = uVar19 + 1;
    }
    if (iVar18 + 1U < 600) {
      iVar15 = 0;
      iVar14 = ((uVar10 & 0xffff) / 0x3c) * 0x3a;
      puVar1 = (undefined4 *)
               ((long)ppdVar6[(ushort)(((int)(uVar13 / 0x3c) * 0x3a + iVar18 + 0x1bU & 0xffff) /
                                      0x76)]->cb[0].pad +
               ((ulong)((iVar18 + iVar14 + ((local_98 + iVar14 & 0xffffU) / 0x76) * -0x76 + 0x1b &
                        0xffff) << 5) - 0x18));
      *puVar1 = 0x4000008;
      puVar1[1] = uVar11;
      puVar1[2] = uVar11;
      puVar1[3] = 4;
      puVar1[5] = 0;
      initDMAgo(dmaAddr,iVar4 + 0x340);
      waveEndPtr = puVar1 + 5;
    }
    else {
      iVar15 = -0x77;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        myTimeStamp();
        __format = "%s %s: chain is too long (%d)\n";
        uVar13 = uVar19 + 2 & 0xffffffff;
LAB_001146ff:
        fprintf(pFVar8,__format,myTimeStamp::buf,"gpioWaveChain",uVar13);
      }
    }
  }
  return iVar15;
}

Assistant:

int gpioWaveChain(char *buf, unsigned bufSize)
{
   unsigned blklen=16, blocks=4;
   int cb, chaincb;
   rawCbs_t *p;
   int i, wid, cmd, loop, counters;
   unsigned cycles, delayCBs, dcb, delayLeft;
   uint32_t repeat, next, *endPtr;
   int stk_pos[10], stk_lev=0;

   cb = 0;
   loop = -1;

   DBG(DBG_USER, "bufSize=%d [%s]", bufSize, myBuf2Str(bufSize, buf));

   CHECK_INITED;

   if (!waveClockInited)
   {
      stopHardwarePWM();
      initClock(0); /* initialise secondary clock */
      waveClockInited = 1;
      PWMClockInited = 0;
   }

   dmaOut[DMA_CS] = DMA_CHANNEL_RESET;
   dmaOut[DMA_CONBLK_AD] = 0;
   waveEndPtr = NULL;
   endPtr = NULL;

   /* add delay cb at start of DMA */

   p = rawWaveCBAdr(chainGetCB(cb++));

   /* use the secondary clock */

   if (gpioCfg.clockPeriph != PI_CLOCK_PCM)
   {
      p->info = NORMAL_DMA | TIMED_DMA(2);
      p->dst  = PCM_TIMER;
   }
   else
   {
      p->info = NORMAL_DMA | TIMED_DMA(5);
      p->dst  = PWM_TIMER;
   }

   p->src    = (uint32_t) (&dmaOBus[0]->periphData);
   p->length = BPD * 20 / PI_WF_MICROS; /* 20 micros delay */
   p->next   = waveCbPOadr(chainGetCB(cb));

   counters = 0;
   wid = -1;

   i = 0;

   while (i<bufSize)
   {
      wid = (unsigned)buf[i];

      if (wid == 255) /* wave command */
      {
         if ((i+2) > bufSize)
            SOFT_ERROR(PI_BAD_CHAIN_CMD,
               "incomplete chain command (at %d)", i);

         cmd = buf[i+1];

         if (cmd == 0) /* loop begin */
         {
            if (stk_lev >= (sizeof(stk_pos)/sizeof(int)))
               SOFT_ERROR(PI_CHAIN_NESTING,
                  "chain counters nested too deep (at %d)", i);

            stk_pos[stk_lev++] = cb;

            i += 2;
         }
         else if (cmd == 1) /* loop end */
         {
            if (counters >= WCB_COUNTERS)
               SOFT_ERROR(PI_CHAIN_COUNTER,
                  "too many chain counters (at %d)", i);

            if ((i+4) > bufSize)
               SOFT_ERROR(PI_BAD_CHAIN_CMD,
                  "incomplete chain command (at %d)", i);

            loop = 0;
            if (--stk_lev >= 0) loop = stk_pos[stk_lev];

            if ((loop < 1) || (loop == cb))
               SOFT_ERROR(PI_BAD_CHAIN_LOOP,
                  "empty chain loop (at %d)", i);

            cycles = ((unsigned)buf[i+3] <<  8) + (unsigned)buf[i+2];

            i += 4;

            if (cycles > PI_MAX_WAVE_CYCLES)
               SOFT_ERROR(PI_CHAIN_LOOP_CNT,
                  "bad chain loop count (%d)", cycles);

            if (cycles == 0)
            {
               /* Skip the complete loop block.  Change
                  the next pointing to the start of the
                  loop block to the current cb.
               */
               p = rawWaveCBAdr(chainGetCB(loop));
               p->next = waveCbPOadr(chainGetCB(cb));
            }
            else if (cycles == 1)
            {
               /* Nothing to do, no need for a counter. */
            }
            else
            {
               chaincb = chainGetCB(cb++);
               if (chaincb < 0)
                  SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

               p = rawWaveCBAdr(chaincb);

               repeat = waveCbPOadr(chainGetCB(loop));

                /* Need to check next cb as well. */

               chaincb = chainGetCB(cb);

               if (chaincb < 0)
                  SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

               next = waveCbPOadr(chainGetCB(cb));

               /* dummy src and dest */
               p->info = NORMAL_DMA;
               p->src = (uint32_t) (&dmaOBus[0]->periphData);
               p->dst = (uint32_t) (&dmaOBus[0]->periphData);
               p->length = 4;
               p->next = waveCbPOadr(chainGetCntCB(counters));

               chainMakeCounter(counters, blklen, blocks,
                            cycles-1, repeat, next);

               counters++;
            }
         }
         else if (cmd == 2) /* delay us */
         {
            if ((i+4) > bufSize)
               SOFT_ERROR(PI_BAD_CHAIN_CMD,
                  "incomplete chain command (at %d)", i);

            cycles = ((unsigned)buf[i+3] <<  8) + (unsigned)buf[i+2];

            i += 4;

            if (cycles > PI_MAX_WAVE_DELAY)
               SOFT_ERROR(PI_BAD_CHAIN_DELAY,
                  "bad chain delay micros (%d)", cycles);

            if (cycles)
            {
               delayLeft = cycles;
               delayCBs = waveDelayCBs(delayLeft);
               for (dcb=0; dcb<delayCBs; dcb++)
               {
                  chaincb = chainGetCB(cb++);

                  if (chaincb < 0)
                     SOFT_ERROR(
                        PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

                  p = rawWaveCBAdr(chaincb);

                  /* use the secondary clock */

                  if (gpioCfg.clockPeriph != PI_CLOCK_PCM)
                  {
                     p->info = NORMAL_DMA | TIMED_DMA(2);
                     p->dst  = PCM_TIMER;
                  }
                  else
                  {
                     p->info = NORMAL_DMA | TIMED_DMA(5);
                     p->dst  = PWM_TIMER;
                  }

                  p->src = (uint32_t) (&dmaOBus[0]->periphData);

                  p->length = BPD * delayLeft / PI_WF_MICROS;

                  if ((gpioCfg.DMAsecondaryChannel >= DMA_LITE_FIRST) &&
                      (p->length > DMA_LITE_MAX))
                  {
                     p->length = DMA_LITE_MAX;
                  }

                  delayLeft -= (p->length / BPD);

                  p->next = waveCbPOadr(chainGetCB(cb));
               }
            }
         }
         else if (cmd == 3) /* repeat loop forever */
         {
            i += 2;

            loop = 0;
            if (--stk_lev >= 0) loop = stk_pos[stk_lev];

            if ((loop < 1) || (loop == cb))
               SOFT_ERROR(PI_BAD_CHAIN_LOOP,
                  "empty chain loop (at %d)", i);

            chaincb = chainGetCB(cb++);
            if (chaincb < 0)
               SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

            if (i < bufSize)
               SOFT_ERROR(PI_BAD_FOREVER,
                  "loop forever must be last command");

            p = rawWaveCBAdr(chaincb);

            /* dummy src and dest */
            p->info = NORMAL_DMA;
            p->src = (uint32_t) (&dmaOBus[0]->periphData);
            p->dst = (uint32_t) (&dmaOBus[0]->periphData);
            p->length = 4;
            p->next = waveCbPOadr(chainGetCB(loop));
            endPtr = &p->next;
         }
         else
            SOFT_ERROR(PI_BAD_CHAIN_CMD,
               "unknown chain command (255 %d)", cmd);
      }
      else if ((wid >= waveOutCount) || waveInfo[wid].deleted)
         SOFT_ERROR(PI_BAD_WAVE_ID, "undefined wave (%d)", wid);
      else
      {
         chaincb = chainGetCB(cb++);

         if (chaincb < 0)
            SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

         p = rawWaveCBAdr(chaincb);

         chaincb = chainGetCB(cb);

         if (chaincb < 0)
            SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

         chainSetVal(cb-1, waveCbPOadr(chaincb));

         /* patch next of wid topCB to next cb */

         p->info   = NORMAL_DMA;
         p->src    = chainGetValPadr(cb-1); /* this next */
         p->dst    = waveCbPOadr(waveInfo[wid].topCB) + 20; /* wid next */
         p->length = 4;
         p->next   = waveCbPOadr(waveInfo[wid].botCB+1);

         i += 1;
      }
   }

   chaincb = chainGetCB(cb++);

   if (chaincb < 0)
      SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

   p = rawWaveCBAdr(chaincb);

   p->info   = NORMAL_DMA;
   p->src    = (uint32_t) (&dmaOBus[0]->periphData);
   p->dst    = (uint32_t) (&dmaOBus[0]->periphData);
   p->length = 4;
   p->next = 0;

   if (!endPtr) endPtr = &p->next;

   initDMAgo((uint32_t *)dmaOut, waveCbPOadr(chainGetCB(0)));

   waveEndPtr = endPtr;

   return 0;
}